

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTestSuite<NoiseModelUpdateTest,_testing::internal::Templates<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForWhiteRandomNoise,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForScaledWhiteNoise,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForCorrelatedNoise,_gtest_suite_NoiseModelUpdateTest_::NoiseStrengthChangeSignalsDifferentNoiseType,_gtest_suite_NoiseModelUpdateTest_::NoiseCoeffsSignalsDifferentNoiseType>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  FILE *__stream;
  bool bVar1;
  CodeLocation *code_location_00;
  char *pcVar2;
  int line;
  char *str;
  string test_name;
  string local_b8;
  CodeLocation local_98;
  string local_70;
  string local_50;
  
  pcVar2 = case_name;
  RegisterTypeParameterizedTestSuiteInstantiation(case_name);
  line = (int)pcVar2;
  GetPrefixUntilComma_abi_cxx11_(&local_50,(internal *)test_names,str);
  StripTrailingSpaces(&local_b8,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = TypedTestSuitePState::TestExists(state,&local_b8);
  __stream = _stderr;
  if (bVar1) {
    code_location_00 = TypedTestSuitePState::GetCodeLocation(state,&local_b8);
    TypeParameterizedTest<NoiseModelUpdateTest,_testing::internal::TemplateSel<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
    ::Register(prefix,code_location_00,case_name,test_names,0,type_names);
    CodeLocation::CodeLocation(&local_98,code_location);
    pcVar2 = SkipComma(test_names);
    bVar1 = TypeParameterizedTestSuite<NoiseModelUpdateTest,_testing::internal::Templates<gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForWhiteRandomNoise,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForScaledWhiteNoise,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForCorrelatedNoise,_gtest_suite_NoiseModelUpdateTest_::NoiseStrengthChangeSignalsDifferentNoiseType,_gtest_suite_NoiseModelUpdateTest_::NoiseCoeffsSignalsDifferentNoiseType>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
            ::Register(prefix,&local_98,state,case_name,pcVar2,type_names);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    return bVar1;
  }
  FormatFileLocation_abi_cxx11_
            (&local_70,(internal *)(code_location->file)._M_dataplus._M_p,
             (char *)(ulong)(uint)code_location->line,line);
  fprintf(__stream,"Failed to get code location for test %s.%s at %s.",case_name,
          local_b8._M_dataplus._M_p,local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix, code_location,
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }